

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

TemplateString * __thiscall
ctemplate::TemplateDictionary::GetValue
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,TemplateString *variable)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  char *pcVar2;
  size_t sVar3;
  undefined7 uVar4;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  *c;
  int iVar5;
  TemplateId TVar6;
  second_type *psVar7;
  TemplateDictionary *d;
  TemplateDictionary *pTVar8;
  VariableDict *template_global_vars;
  bool bVar9;
  ReaderMutexLock ml;
  ReaderMutexLock local_38;
  
  bVar9 = false;
  pTVar8 = this;
  do {
    psVar1 = pTVar8->variable_dict_;
    if (psVar1 != (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                   *)0x0) {
      TVar6 = TemplateString::GetGlobalId(variable);
      psVar7 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar6);
      if (psVar7 != (second_type *)0x0) {
        pcVar2 = psVar7->ptr_;
        sVar3 = psVar7->length_;
        uVar4 = *(undefined7 *)&psVar7->field_0x11;
        TVar6 = psVar7->id_;
        __return_storage_ptr__->is_immutable_ = psVar7->is_immutable_;
        *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar4;
        __return_storage_ptr__->id_ = TVar6;
        __return_storage_ptr__->ptr_ = pcVar2;
        __return_storage_ptr__->length_ = sVar3;
        if (!bVar9) {
          return __return_storage_ptr__;
        }
        break;
      }
    }
    pTVar8 = pTVar8->parent_dict_;
    bVar9 = pTVar8 == (TemplateDictionary *)0x0;
  } while (!bVar9);
  if (this->template_global_dict_owner_ == (TemplateDictionary *)0x0) {
    __assert_fail("template_global_dict_owner_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                  ,0x38b,
                  "virtual TemplateString ctemplate::TemplateDictionary::GetValue(const TemplateString &) const"
                 );
  }
  pTVar8 = this->template_global_dict_owner_->template_global_dict_;
  if ((pTVar8 != (TemplateDictionary *)0x0) &&
     (psVar1 = pTVar8->variable_dict_,
     psVar1 != (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                *)0x0)) {
    TVar6 = TemplateString::GetGlobalId(variable);
    psVar7 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                       (psVar1,TVar6);
    if (psVar7 != (second_type *)0x0) {
      pcVar2 = psVar7->ptr_;
      sVar3 = psVar7->length_;
      uVar4 = *(undefined7 *)&psVar7->field_0x11;
      TVar6 = psVar7->id_;
      __return_storage_ptr__->is_immutable_ = psVar7->is_immutable_;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar4;
      __return_storage_ptr__->id_ = TVar6;
      __return_storage_ptr__->ptr_ = pcVar2;
      __return_storage_ptr__->length_ = sVar3;
      return __return_storage_ptr__;
    }
  }
  local_38.mu_ = (Mutex *)g_static_mutex;
  if ((g_static_mutex[0x38] == '\x01') &&
     (iVar5 = pthread_rwlock_rdlock((pthread_rwlock_t *)g_static_mutex), iVar5 != 0)) {
    abort();
  }
  c = global_dict_;
  TVar6 = TemplateString::GetGlobalId(variable);
  psVar7 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,unsigned_long>
                     (c,TVar6);
  if (psVar7 == (second_type *)0x0) {
    psVar7 = empty_string_;
  }
  pcVar2 = psVar7->ptr_;
  sVar3 = psVar7->length_;
  uVar4 = *(undefined7 *)&psVar7->field_0x11;
  TVar6 = psVar7->id_;
  __return_storage_ptr__->is_immutable_ = psVar7->is_immutable_;
  *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar4;
  __return_storage_ptr__->id_ = TVar6;
  __return_storage_ptr__->ptr_ = pcVar2;
  __return_storage_ptr__->length_ = sVar3;
  ReaderMutexLock::~ReaderMutexLock(&local_38);
  return __return_storage_ptr__;
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->variable_dict_) {
      if (const TemplateString* it = find_ptr(*d->variable_dict_, variable.GetGlobalId()))
        return *it;
    }
  }

  // No match in the dict tree. Check the template-global dict.
  assert(template_global_dict_owner_ != NULL);
  if (template_global_dict_owner_->template_global_dict_
      && template_global_dict_owner_->template_global_dict_->variable_dict_) {
    const VariableDict* template_global_vars =
        template_global_dict_owner_->template_global_dict_->variable_dict_;

    if (const TemplateString* it = find_ptr(*template_global_vars, variable.GetGlobalId()))
      return *it;
  }

  // No match in dict tree or template-global dict.  Last chance: global dict.
  {
    ReaderMutexLock ml(&g_static_mutex);
    if (const TemplateString* it = find_ptr(*global_dict_, variable.GetGlobalId()))
      return *it;
    return *empty_string_;
  }
}